

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

void __thiscall
fmt::internal::PrintfFormatter<char>::format
          (PrintfFormatter<char> *this,BasicWriter<char> *writer,BasicCStringRef<char> format_str)

{
  byte *pbVar1;
  byte bVar2;
  uint arg_index;
  int iVar3;
  FormatError *this_00;
  Arg *arg_00;
  BasicCStringRef<char> start;
  bool bVar4;
  char *s;
  Arg arg;
  byte *local_90;
  anon_union_16_12_986ea841_for_Value_0 *local_88;
  FormatSpec *local_80;
  FormatSpec local_78;
  anon_union_16_12_986ea841_for_Value_0 local_58;
  int local_48;
  
  start.data_ = format_str.data_;
  local_90 = (byte *)format_str.data_;
  if (*format_str.data_ != '\0') {
    do {
      local_90 = (byte *)format_str.data_ + 1;
      if (*format_str.data_ == 0x25) {
        if (*local_90 == 0x25) {
          FormatterBase::write<char>(&this->super_FormatterBase,writer,start.data_,(char *)local_90)
          ;
          start.data_ = (char *)(local_90 + 1);
          local_90 = (byte *)start.data_;
        }
        else {
          FormatterBase::write<char>(&this->super_FormatterBase,writer,start.data_,format_str.data_)
          ;
          local_78.super_AlignSpec.super_WidthSpec.width_ = 0;
          local_78.super_AlignSpec.super_WidthSpec.fill_ = L' ';
          local_78.precision_ = 0xffffffff;
          local_78.type_ = '\0';
          local_78.super_AlignSpec.align_ = ALIGN_RIGHT;
          local_78.flags_ = 0;
          arg_index = parse_header(this,(char **)&local_90,&local_78);
          pbVar1 = local_90;
          if (*local_90 == 0x2e) {
            if ((byte)(local_90[1] - 0x30) < 10) {
              local_90 = local_90 + 1;
              local_78.precision_ = parse_nonnegative_int<char>((char **)&local_90);
              pbVar1 = local_90;
            }
            else {
              pbVar1 = local_90 + 1;
              if (local_90[1] == 0x2a) {
                local_90 = local_90 + 2;
                arg_00 = (Arg *)this;
                get_arg((Arg *)&local_58.string,this,(char *)local_90,0xffffffff);
                local_78.precision_ =
                     ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int>::visit
                               ((ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int> *)
                                &local_58.string,arg_00);
                pbVar1 = local_90;
              }
            }
          }
          local_90 = pbVar1;
          get_arg((Arg *)&local_58.string,this,(char *)local_90,arg_index);
          if ((local_78._8_8_ & 0x800000000) != 0) {
            switch(local_48) {
            case 2:
            case 3:
            case 6:
            case 7:
              bVar4 = local_58.int_value == 0;
              break;
            case 4:
            case 5:
              bVar4 = CONCAT44(local_58.long_long_value._4_4_,local_58.int_value) == 0;
              break;
            default:
              goto switchD_00197ed6_default;
            }
            if (bVar4) {
              local_78._8_8_ = local_78._8_8_ & 0xfffffff7ffffffff;
            }
          }
switchD_00197ed6_default:
          if (local_78.super_AlignSpec.super_WidthSpec.fill_ == L'0') {
            if (local_48 < 10) {
              local_78.super_AlignSpec.align_ = 4;
            }
            else {
              local_78.super_AlignSpec.super_WidthSpec.fill_ = L' ';
            }
          }
          pbVar1 = local_90 + 1;
          bVar2 = *local_90;
          if (bVar2 < 0x6c) {
            if (bVar2 != 0x4c) {
              if (bVar2 == 0x68) {
                if ((char)*pbVar1 == 0x68) {
                  local_80 = (FormatSpec *)CONCAT44(local_80._4_4_,(int)(char)local_90[2]);
                  local_90 = local_90 + 2;
                  local_88 = &local_58;
                  ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>::visit
                            ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>
                              *)&local_88,(Arg *)&local_58.string);
                  pbVar1 = local_90;
                }
                else {
                  local_80 = (FormatSpec *)CONCAT44(local_80._4_4_,(int)(char)*pbVar1);
                  local_90 = pbVar1;
                  local_88 = &local_58;
                  ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void>::visit
                            ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void> *)
                             &local_88,(Arg *)&local_58.string);
                  pbVar1 = local_90;
                }
              }
              else {
                if (bVar2 == 0x6a) goto LAB_00197f6d;
LAB_00197fb4:
                local_80 = (FormatSpec *)CONCAT44(local_80._4_4_,(int)(char)*local_90);
                local_88 = &local_58;
                ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void>::visit
                          ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void> *)
                           &local_88,(Arg *)&local_58.string);
                pbVar1 = local_90;
              }
            }
          }
          else if (bVar2 == 0x6c) {
            iVar3 = (int)(char)*pbVar1;
            if (iVar3 != 0x6c) goto LAB_00197f79;
            local_80 = (FormatSpec *)CONCAT44(local_80._4_4_,(int)(char)local_90[2]);
            local_90 = local_90 + 2;
            local_88 = &local_58;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void> *)
                       &local_88,(Arg *)&local_58.string);
            pbVar1 = local_90;
          }
          else if (bVar2 == 0x74) {
LAB_00197f6d:
            iVar3 = (int)(char)*pbVar1;
LAB_00197f79:
            local_80 = (FormatSpec *)CONCAT44(local_80._4_4_,iVar3);
            local_90 = pbVar1;
            local_88 = &local_58;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)&local_88
                       ,(Arg *)&local_58.string);
            pbVar1 = local_90;
          }
          else {
            if (bVar2 != 0x7a) goto LAB_00197fb4;
            local_80 = (FormatSpec *)CONCAT44(local_80._4_4_,(int)(char)*pbVar1);
            local_90 = pbVar1;
            local_88 = &local_58;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void> *)
                       &local_88,(Arg *)&local_58.string);
            pbVar1 = local_90;
          }
          local_90 = pbVar1;
          if (*local_90 == 0) {
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x1a1488);
            __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
          }
          pbVar1 = local_90 + 1;
          local_78.type_ = *local_90;
          local_90 = pbVar1;
          if (local_48 < 8) {
            if (local_78.type_ == 99) {
              local_88 = &local_58;
              ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void>::visit
                        ((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)&local_88,
                         (Arg *)&local_58.string);
            }
            else if ((local_78.type_ == 0x75) || (local_78.type_ == 0x69)) {
              local_78.type_ = 100;
            }
          }
          start.data_ = (char *)local_90;
          local_88 = (anon_union_16_12_986ea841_for_Value_0 *)writer;
          local_80 = &local_78;
          ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void>::visit
                    ((ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *)&local_88,
                     (Arg *)&local_58.string);
        }
      }
      format_str.data_ = (char *)local_90;
    } while (*local_90 != 0);
  }
  FormatterBase::write<char>(&this->super_FormatterBase,writer,start.data_,(char *)local_90);
  return;
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::format(
    BasicWriter<Char> &writer, BasicCStringRef<Char> format_str) {
  const Char *start = format_str.c_str();
  const Char *s = start;
  while (*s) {
    Char c = *s++;
    if (c != '%') continue;
    if (*s == c) {
      write(writer, start, s);
      start = ++s;
      continue;
    }
    write(writer, start, s - 1);

    FormatSpec spec;
    spec.align_ = ALIGN_RIGHT;

    // Parse argument index, flags and width.
    unsigned arg_index = parse_header(s, spec);

    // Parse precision.
    if (*s == '.') {
      ++s;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = static_cast<int>(parse_nonnegative_int(s));
      } else if (*s == '*') {
        ++s;
        spec.precision_ = fmt::PrecisionHandler().visit(get_arg(s));
      }
    }

    Arg arg = get_arg(s, arg_index);
    if (spec.flag(HASH_FLAG) && fmt::IsZeroInt().visit(arg))
      spec.flags_ &= ~to_unsigned<int>(HASH_FLAG);
    if (spec.fill_ == '0') {
      if (arg.type <= Arg::LAST_NUMERIC_TYPE)
        spec.align_ = ALIGN_NUMERIC;
      else
        spec.fill_ = ' ';  // Ignore '0' flag for non-numeric types.
    }

    // Parse length and convert the argument to the required type.
    switch (*s++) {
    case 'h':
      if (*s == 'h')
        fmt::ArgConverter<signed char>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<short>(arg, *s).visit(arg);
      break;
    case 'l':
      if (*s == 'l')
        fmt::ArgConverter<fmt::LongLong>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<long>(arg, *s).visit(arg);
      break;
    case 'j':
      fmt::ArgConverter<intmax_t>(arg, *s).visit(arg);
      break;
    case 'z':
      fmt::ArgConverter<std::size_t>(arg, *s).visit(arg);
      break;
    case 't':
      fmt::ArgConverter<std::ptrdiff_t>(arg, *s).visit(arg);
      break;
    case 'L':
      // printf produces garbage when 'L' is omitted for long double, no
      // need to do the same.
      break;
    default:
      --s;
      fmt::ArgConverter<void>(arg, *s).visit(arg);
    }

    // Parse type.
    if (!*s)
      FMT_THROW(FormatError("invalid format string"));
    spec.type_ = static_cast<char>(*s++);
    if (arg.type <= Arg::LAST_INTEGER_TYPE) {
      // Normalize type.
      switch (spec.type_) {
      case 'i': case 'u':
        spec.type_ = 'd';
        break;
      case 'c':
        // TODO: handle wchar_t
        fmt::CharConverter(arg).visit(arg);
        break;
      }
    }

    start = s;

    // Format argument.
    internal::PrintfArgFormatter<Char>(writer, spec).visit(arg);
  }
  write(writer, start, s);
}